

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode * __thiscall JSONNode::at(JSONNode *this,json_index_t pos)

{
  json_index_t jVar1;
  out_of_range *this_00;
  string *psVar2;
  JSONNode *pJVar3;
  json_index_t pos_local;
  JSONNode *this_local;
  
  jVar1 = internalJSONNode::size(this->internal);
  if (jVar1 <= pos) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    psVar2 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
    std::out_of_range::out_of_range(this_00,(string *)psVar2);
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pJVar3 = operator[](this,pos);
  return pJVar3;
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    if (json_unlikely(pos >= internal -> size())){
	   JSON_FAIL(JSON_TEXT("at() const out of bounds"));
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }
    return (*this)[pos];
}